

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void exp_repeat_pop(lyxp_expr *exp,uint16_t exp_idx)

{
  LY_ERR *pLVar1;
  ushort local_14;
  uint16_t i;
  uint16_t exp_idx_local;
  lyxp_expr *exp_local;
  
  if (exp->repeat[exp_idx] == (uint8_t *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c",
           0x636);
  }
  else {
    local_14 = 0;
    while (exp->repeat[exp_idx][(int)(local_14 + 1)] != '\0') {
      local_14 = local_14 + 1;
    }
    exp->repeat[exp_idx][local_14] = '\0';
  }
  return;
}

Assistant:

static void
exp_repeat_pop(struct lyxp_expr *exp, uint16_t exp_idx)
{
    uint16_t i;

    if (!exp->repeat[exp_idx]) {
        LOGINT;
        return;
    }

    for (i = 0; exp->repeat[exp_idx][i + 1]; ++i);

    exp->repeat[exp_idx][i] = 0;
}